

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

int decompose(int n,int *ifac,int *ntryh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int ib;
  int nr;
  int nq;
  int ntry;
  int j;
  int i;
  int nf;
  int nl;
  int *ntryh_local;
  int *ifac_local;
  int n_local;
  
  j = 0;
  i = n;
  for (nq = 0; ntryh[nq] != 0; nq = nq + 1) {
    iVar1 = ntryh[nq];
    while ((i != 1 && (iVar2 = i / iVar1, i == iVar1 * iVar2))) {
      iVar3 = j + 1;
      ifac[j + 2] = iVar1;
      j = iVar3;
      i = iVar2;
      if ((iVar1 == 2) && (iVar3 != 1)) {
        for (ntry = 2; ntry <= iVar3; ntry = ntry + 1) {
          ifac[(iVar3 - ntry) + 3] = ifac[(iVar3 - ntry) + 2];
        }
        ifac[2] = 2;
      }
    }
  }
  *ifac = n;
  ifac[1] = j;
  return j;
}

Assistant:

static int decompose(int n, int *ifac, const int *ntryh) {
  int nl = n, nf = 0, i, j = 0;
  for (j=0; ntryh[j]; ++j) {
    int ntry = ntryh[j];
    while (nl != 1) {
      int nq = nl / ntry;
      int nr = nl - ntry * nq;
      if (nr == 0) {
        ifac[2+nf++] = ntry;
        nl = nq;
        if (ntry == 2 && nf != 1) {
          for (i = 2; i <= nf; ++i) {
            int ib = nf - i + 2;
            ifac[ib + 1] = ifac[ib];
          }
          ifac[2] = 2;
        }
      } else break;
    }
  }
  ifac[0] = n;
  ifac[1] = nf;  
  return nf;
}